

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

int luaV_lessequal(lua_State *L,TValue *l,TValue *r)

{
  unsigned_short *puVar1;
  double dVar2;
  lua_CFunction p_Var3;
  long lVar4;
  int iVar5;
  lua_CFunction p_Var6;
  uint uVar7;
  bool bVar8;
  
  uVar7 = l->tt_ & 0xf;
  if (uVar7 == 4) {
    if ((r->tt_ & 0xfU) == 4) {
      iVar5 = l_strcmp((TString *)(l->value_).gc,(TString *)(r->value_).gc);
      return (uint)(iVar5 < 1);
    }
LAB_00113183:
    uVar7 = luaT_callorderTM(L,l,r,TM_LE);
    if ((int)uVar7 < 0) {
      puVar1 = &L->ci->callstatus;
      *puVar1 = *puVar1 | 0x80;
      iVar5 = luaT_callorderTM(L,r,l,TM_LT);
      puVar1 = &L->ci->callstatus;
      *puVar1 = *puVar1 ^ 0x80;
      if (iVar5 < 0) {
        luaG_ordererror(L,l,r);
      }
      uVar7 = (uint)(iVar5 == 0);
    }
    return uVar7;
  }
  if ((uVar7 != 3) || (uVar7 = r->tt_, (uVar7 & 0xf) != 3)) goto LAB_00113183;
  if (l->tt_ == 0x13) {
    p_Var3 = (l->value_).f;
    if (uVar7 == 0x13) {
      p_Var6 = (lua_CFunction)(r->value_).i;
      lVar4 = (long)p_Var3 - (long)p_Var6;
      bVar8 = p_Var3 == p_Var6;
    }
    else {
      dVar2 = (r->value_).n;
      if (p_Var3 + 0x20000000000000 < (code *)0x40000000000001) {
        bVar8 = dVar2 < (double)(long)p_Var3;
        goto LAB_00113215;
      }
      bVar8 = true;
      if (9.223372036854776e+18 <= dVar2) goto LAB_0011329e;
      if (dVar2 < -9.223372036854776e+18) goto LAB_00113266;
      p_Var6 = (lua_CFunction)(long)dVar2;
      lVar4 = (long)p_Var3 - (long)p_Var6;
      bVar8 = lVar4 == 0;
    }
    bVar8 = bVar8 || SBORROW8((long)p_Var3,(long)p_Var6) != lVar4 < 0;
  }
  else {
    dVar2 = (l->value_).n;
    if (uVar7 != 3) {
      if (!NAN(dVar2)) {
        lVar4 = (r->value_).i;
        if (lVar4 + 0x20000000000000U < 0x40000000000001) {
          bVar8 = (double)lVar4 < dVar2;
        }
        else {
          bVar8 = true;
          if (dVar2 < 9.223372036854776e+18) {
            if (dVar2 <= -9.223372036854776e+18) {
              bVar8 = false;
            }
            else {
              bVar8 = lVar4 < (long)dVar2;
            }
          }
        }
        bVar8 = (bool)(bVar8 ^ 1);
        goto LAB_0011329e;
      }
LAB_00113266:
      bVar8 = false;
      goto LAB_0011329e;
    }
    bVar8 = (r->value_).n < dVar2;
LAB_00113215:
    bVar8 = !bVar8;
  }
LAB_0011329e:
  return (uint)bVar8;
}

Assistant:

int luaV_lessequal (lua_State *L, const TValue *l, const TValue *r) {
  int res;
  if (ttisnumber(l) && ttisnumber(r))  /* both operands are numbers? */
    return LEnum(l, r);
  else if (ttisstring(l) && ttisstring(r))  /* both are strings? */
    return l_strcmp(tsvalue(l), tsvalue(r)) <= 0;
  else if ((res = luaT_callorderTM(L, l, r, TM_LE)) >= 0)  /* try 'le' */
    return res;
  else {  /* try 'lt': */
    L->ci->callstatus |= CIST_LEQ;  /* mark it is doing 'lt' for 'le' */
    res = luaT_callorderTM(L, r, l, TM_LT);
    L->ci->callstatus ^= CIST_LEQ;  /* clear mark */
    if (res < 0)
      luaG_ordererror(L, l, r);
    return !res;  /* result is negated */
  }
}